

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ships.cpp
# Opt level: O2

map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
* __thiscall
Ships::EnumerateShips
          (map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
           *__return_storage_ptr__,Ships *this)

{
  _Rb_tree_header *p_Var1;
  __shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr p_Var2;
  int count;
  pair<const_int,_std::shared_ptr<Ship>_> ship;
  map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ships;
  key_type local_7c;
  pair<const_int,_std::shared_ptr<Ship>_> local_78;
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Ship>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Ship>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  local_60;
  
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Ship>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Ship>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Ship>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Ship>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
              *)this);
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_7c = 0;
  for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::pair<const_int,_std::shared_ptr<Ship>_>::pair
              (&local_78,(pair<const_int,_std::shared_ptr<Ship>_> *)(p_Var2 + 1));
    local_7c = local_7c + 1;
    this_00 = &std::
               map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
               ::operator[](__return_storage_ptr__,&local_7c)->
               super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&local_78.second.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.second.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Ship>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Ship>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::map<int, std::shared_ptr<Ship>> Ships::EnumerateShips() {
    auto ships = GetShips();
    std::map<int, std::shared_ptr<Ship>> ship_map;
    int count = 0;
    for(auto ship : ships) {
        count++;
        ship_map[count] = ship.second;
    }
    return ship_map;
}